

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O0

void passphrase_done(uxpgnt_client *upc,_Bool success)

{
  PageantClientDialogId *dlgid_00;
  strbuf *psVar1;
  char *pcVar2;
  ptrlen passphrase;
  PageantClientDialogId *dlgid;
  _Bool success_local;
  uxpgnt_client *upc_local;
  
  dlgid_00 = upc->dlgid;
  upc->dlgid = (PageantClientDialogId *)0x0;
  upc->prompt_active = false;
  if (upc->logfp != (FILE *)0x0) {
    pcVar2 = "failure";
    if (success) {
      pcVar2 = "success";
    }
    fprintf((FILE *)upc->logfp,"pageant passphrase response: %s\n",pcVar2);
  }
  if (success) {
    passphrase = ptrlen_from_strbuf(upc->prompt_buf);
    pageant_passphrase_request_success(dlgid_00,passphrase);
  }
  else {
    pageant_passphrase_request_refused(dlgid_00);
  }
  strbuf_free(upc->prompt_buf);
  psVar1 = strbuf_new_nm();
  upc->prompt_buf = psVar1;
  return;
}

Assistant:

static void passphrase_done(struct uxpgnt_client *upc, bool success)
{
    PageantClientDialogId *dlgid = upc->dlgid;
    upc->dlgid = NULL;
    upc->prompt_active = false;

    if (upc->logfp)
        fprintf(upc->logfp, "pageant passphrase response: %s\n",
                success ? "success" : "failure");

    if (success)
        pageant_passphrase_request_success(
            dlgid, ptrlen_from_strbuf(upc->prompt_buf));
    else
        pageant_passphrase_request_refused(dlgid);

    strbuf_free(upc->prompt_buf);
    upc->prompt_buf = strbuf_new_nm();
}